

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O0

void xmlSAX2StartHtmlElement(xmlParserCtxtPtr ctxt,xmlChar *fullname,xmlChar **atts)

{
  int iVar1;
  xmlNodePtr node;
  long lVar2;
  int local_44;
  xmlChar *pxStack_40;
  int i;
  xmlChar *value;
  xmlChar *att;
  xmlNodePtr parent;
  xmlNodePtr ret;
  xmlChar **atts_local;
  xmlChar *fullname_local;
  xmlParserCtxtPtr ctxt_local;
  
  node = xmlNewDocNode(ctxt->myDoc,(xmlNsPtr)0x0,fullname,(xmlChar *)0x0);
  if (node == (xmlNodePtr)0x0) {
    xmlSAX2ErrMemory(ctxt);
  }
  else {
    ctxt->nodemem = -1;
    xmlSAX2AppendChild(ctxt,node);
    iVar1 = nodePush(ctxt,node);
    if (iVar1 < 0) {
      xmlUnlinkNode(node);
      xmlFreeNode(node);
    }
    else if (atts != (xmlChar **)0x0) {
      local_44 = 2;
      pxStack_40 = atts[1];
      value = *atts;
      while (value != (xmlChar *)0x0) {
        xmlSAX2HtmlAttribute(ctxt,value,pxStack_40);
        iVar1 = local_44 + 1;
        lVar2 = (long)local_44;
        local_44 = local_44 + 2;
        pxStack_40 = atts[iVar1];
        value = atts[lVar2];
      }
    }
  }
  return;
}

Assistant:

static void
xmlSAX2StartHtmlElement(xmlParserCtxtPtr ctxt, const xmlChar *fullname,
                        const xmlChar **atts) {
    xmlNodePtr ret;
    xmlNodePtr parent;
    const xmlChar *att;
    const xmlChar *value;
    int i;

    ret = xmlNewDocNode(ctxt->myDoc, NULL, fullname, NULL);
    if (ret == NULL) {
	xmlSAX2ErrMemory(ctxt);
        return;
    }
    ctxt->nodemem = -1;

    /* Initialize parent before pushing node */
    parent = ctxt->node;
    if (parent == NULL)
        parent = (xmlNodePtr) ctxt->myDoc;

    /*
     * Link the child element
     */
    xmlSAX2AppendChild(ctxt, ret);

    /*
     * We are parsing a new node.
     */
    if (nodePush(ctxt, ret) < 0) {
        xmlUnlinkNode(ret);
        xmlFreeNode(ret);
        return;
    }

    if (atts != NULL) {
        i = 0;
	att = atts[i++];
	value = atts[i++];
        while (att != NULL) {
            xmlSAX2HtmlAttribute(ctxt, att, value);
            att = atts[i++];
            value = atts[i++];
        }
    }
}